

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptHdrWrapper.cpp
# Opt level: O3

QString * OptHdrWrapper::translateSubsystem(DWORD subsystem)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  _Base_ptr p_Var5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  _Rb_tree_color in_ESI;
  QString *in_RDI;
  bool bVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  key_type_conflict2 local_4c;
  QArrayData *local_48;
  char16_t *pcStack_40;
  qsizetype local_38;
  _Rb_tree_color local_24;
  
  local_24 = in_ESI;
  if (s_subsystem._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    local_4c = 0;
    pmVar6 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_4c);
    QVar10.m_data = (storage_type *)0x11;
    QVar10.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar10);
    pQVar1 = &((pmVar6->d).d)->super_QArrayData;
    (pmVar6->d).d = (Data *)local_48;
    pcVar2 = (pmVar6->d).ptr;
    (pmVar6->d).ptr = pcStack_40;
    qVar3 = (pmVar6->d).size;
    (pmVar6->d).size = local_38;
    local_48 = pQVar1;
    pcStack_40 = pcVar2;
    local_38 = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,8);
      }
    }
    local_4c = 1;
    pmVar6 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_4c);
    QVar11.m_data = (storage_type *)0x6;
    QVar11.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar11);
    pQVar1 = &((pmVar6->d).d)->super_QArrayData;
    (pmVar6->d).d = (Data *)local_48;
    pcVar2 = (pmVar6->d).ptr;
    (pmVar6->d).ptr = pcStack_40;
    qVar3 = (pmVar6->d).size;
    (pmVar6->d).size = local_38;
    local_48 = pQVar1;
    pcStack_40 = pcVar2;
    local_38 = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,8);
      }
    }
    local_4c = 2;
    pmVar6 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_4c);
    QVar12.m_data = (storage_type *)0xb;
    QVar12.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar12);
    pQVar1 = &((pmVar6->d).d)->super_QArrayData;
    (pmVar6->d).d = (Data *)local_48;
    pcVar2 = (pmVar6->d).ptr;
    (pmVar6->d).ptr = pcStack_40;
    qVar3 = (pmVar6->d).size;
    (pmVar6->d).size = local_38;
    local_48 = pQVar1;
    pcStack_40 = pcVar2;
    local_38 = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,8);
      }
    }
    local_4c = 3;
    pmVar6 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_4c);
    QVar13.m_data = (storage_type *)0xf;
    QVar13.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar13);
    pQVar1 = &((pmVar6->d).d)->super_QArrayData;
    (pmVar6->d).d = (Data *)local_48;
    pcVar2 = (pmVar6->d).ptr;
    (pmVar6->d).ptr = pcStack_40;
    qVar3 = (pmVar6->d).size;
    (pmVar6->d).size = local_38;
    local_48 = pQVar1;
    pcStack_40 = pcVar2;
    local_38 = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,8);
      }
    }
    local_4c = 5;
    pmVar6 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_4c);
    QVar14.m_data = (storage_type *)0xc;
    QVar14.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar14);
    pQVar1 = &((pmVar6->d).d)->super_QArrayData;
    (pmVar6->d).d = (Data *)local_48;
    pcVar2 = (pmVar6->d).ptr;
    (pmVar6->d).ptr = pcStack_40;
    qVar3 = (pmVar6->d).size;
    (pmVar6->d).size = local_38;
    local_48 = pQVar1;
    pcStack_40 = pcVar2;
    local_38 = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,8);
      }
    }
    local_4c = 7;
    pmVar6 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_4c);
    QVar15.m_data = (storage_type *)0xd;
    QVar15.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar15);
    pQVar1 = &((pmVar6->d).d)->super_QArrayData;
    (pmVar6->d).d = (Data *)local_48;
    pcVar2 = (pmVar6->d).ptr;
    (pmVar6->d).ptr = pcStack_40;
    qVar3 = (pmVar6->d).size;
    (pmVar6->d).size = local_38;
    local_48 = pQVar1;
    pcStack_40 = pcVar2;
    local_38 = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,8);
      }
    }
    local_4c = 8;
    pmVar6 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_4c);
    QVar16.m_data = (storage_type *)0x13;
    QVar16.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar16);
    pQVar1 = &((pmVar6->d).d)->super_QArrayData;
    (pmVar6->d).d = (Data *)local_48;
    pcVar2 = (pmVar6->d).ptr;
    (pmVar6->d).ptr = pcStack_40;
    qVar3 = (pmVar6->d).size;
    (pmVar6->d).size = local_38;
    local_48 = pQVar1;
    pcStack_40 = pcVar2;
    local_38 = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,8);
      }
    }
    local_4c = 9;
    pmVar6 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_4c);
    QVar17.m_data = (storage_type *)0x14;
    QVar17.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar17);
    pQVar1 = &((pmVar6->d).d)->super_QArrayData;
    (pmVar6->d).d = (Data *)local_48;
    pcVar2 = (pmVar6->d).ptr;
    (pmVar6->d).ptr = pcStack_40;
    qVar3 = (pmVar6->d).size;
    (pmVar6->d).size = local_38;
    local_48 = pQVar1;
    pcStack_40 = pcVar2;
    local_38 = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,8);
      }
    }
    local_4c = 10;
    pmVar6 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_4c);
    QVar18.m_data = (storage_type *)0xf;
    QVar18.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar18);
    pQVar1 = &((pmVar6->d).d)->super_QArrayData;
    (pmVar6->d).d = (Data *)local_48;
    pcVar2 = (pmVar6->d).ptr;
    (pmVar6->d).ptr = pcStack_40;
    qVar3 = (pmVar6->d).size;
    (pmVar6->d).size = local_38;
    local_48 = pQVar1;
    pcStack_40 = pcVar2;
    local_38 = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,8);
      }
    }
    local_4c = 0xb;
    pmVar6 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_4c);
    QVar19.m_data = (storage_type *)0x17;
    QVar19.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar19);
    pQVar1 = &((pmVar6->d).d)->super_QArrayData;
    (pmVar6->d).d = (Data *)local_48;
    pcVar2 = (pmVar6->d).ptr;
    (pmVar6->d).ptr = pcStack_40;
    qVar3 = (pmVar6->d).size;
    (pmVar6->d).size = local_38;
    local_48 = pQVar1;
    pcStack_40 = pcVar2;
    local_38 = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,8);
      }
    }
    local_4c = 0xc;
    pmVar6 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_4c);
    QVar20.m_data = (storage_type *)0x12;
    QVar20.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar20);
    pQVar1 = &((pmVar6->d).d)->super_QArrayData;
    (pmVar6->d).d = (Data *)local_48;
    pcVar2 = (pmVar6->d).ptr;
    (pmVar6->d).ptr = pcStack_40;
    qVar3 = (pmVar6->d).size;
    (pmVar6->d).size = local_38;
    local_48 = pQVar1;
    pcStack_40 = pcVar2;
    local_38 = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,8);
      }
    }
    local_4c = 0xd;
    pmVar6 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_4c);
    QVar21.m_data = (storage_type *)0x7;
    QVar21.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar21);
    pQVar1 = &((pmVar6->d).d)->super_QArrayData;
    (pmVar6->d).d = (Data *)local_48;
    pcVar2 = (pmVar6->d).ptr;
    (pmVar6->d).ptr = pcStack_40;
    qVar3 = (pmVar6->d).size;
    (pmVar6->d).size = local_38;
    local_48 = pQVar1;
    pcStack_40 = pcVar2;
    local_38 = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,8);
      }
    }
    local_4c = 0xe;
    pmVar6 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_4c);
    QVar22.m_data = (storage_type *)0x4;
    QVar22.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar22);
    pQVar1 = &((pmVar6->d).d)->super_QArrayData;
    (pmVar6->d).d = (Data *)local_48;
    pcVar2 = (pmVar6->d).ptr;
    (pmVar6->d).ptr = pcStack_40;
    qVar3 = (pmVar6->d).size;
    (pmVar6->d).size = local_38;
    local_48 = pQVar1;
    pcStack_40 = pcVar2;
    local_38 = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,8);
      }
    }
    local_4c = 0x10;
    pmVar6 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_4c);
    QVar23.m_data = (storage_type *)0x18;
    QVar23.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar23);
    pQVar1 = &((pmVar6->d).d)->super_QArrayData;
    (pmVar6->d).d = (Data *)local_48;
    pcVar2 = (pmVar6->d).ptr;
    (pmVar6->d).ptr = pcStack_40;
    qVar3 = (pmVar6->d).size;
    (pmVar6->d).size = local_38;
    local_48 = pQVar1;
    pcStack_40 = pcVar2;
    local_38 = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,8);
      }
    }
  }
  if (s_subsystem._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var5 = &s_subsystem._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var7 = s_subsystem._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      bVar8 = p_Var7[1]._M_color < local_24;
      if (!bVar8) {
        p_Var5 = p_Var7;
      }
      p_Var7 = (&p_Var7->_M_left)[bVar8];
    } while (p_Var7 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != &s_subsystem._M_t._M_impl.super__Rb_tree_header) &&
       (p_Var5[1]._M_color <= local_24)) {
      pmVar6 = std::
               map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
               ::operator[](&s_subsystem,&local_24);
      pDVar4 = (pmVar6->d).d;
      (in_RDI->d).d = pDVar4;
      (in_RDI->d).ptr = (pmVar6->d).ptr;
      (in_RDI->d).size = (pmVar6->d).size;
      if (pDVar4 == (Data *)0x0) {
        return in_RDI;
      }
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      return in_RDI;
    }
  }
  QVar9.m_data = (storage_type *)0x0;
  QVar9.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar9);
  (in_RDI->d).d = (Data *)local_48;
  (in_RDI->d).ptr = pcStack_40;
  (in_RDI->d).size = local_38;
  return in_RDI;
}

Assistant:

QString OptHdrWrapper::translateSubsystem(DWORD subsystem)
{
    if (s_subsystem.size() == 0) {
        s_subsystem[pe::SUB_UNKNOWN] = "Unknown subsystem";
        s_subsystem[pe::SUB_NATIVE] = "Driver";
        s_subsystem[pe::SUB_WINDOWS_GUI] = "Windows GUI";
        s_subsystem[pe::SUB_WINDOWS_CUI] = "Windows console";
        s_subsystem[pe::SUB_OS2_CUI] = "OS/2 console";
        s_subsystem[pe::SUB_POSIX_CUI] = "Posix console";
        s_subsystem[pe::SUB_NATIVE_WINDOWS] = "Native Win9x driver";
        s_subsystem[pe::SUB_WINDOWS_CE_GUI] = "Windows CE subsystem";
        s_subsystem[pe::SUB_EFI_APPLICATION] = "EFI_APPLICATION";
        s_subsystem[pe::SUB_EFI_BOOT_SERVICE_DRIVER] = "EFI_BOOT_SERVICE_DRIVER";
        s_subsystem[pe::SUB_EFI_RUNTIME_DRIVER] = "EFI_RUNTIME_DRIVER";
        s_subsystem[pe::SUB_EFI_ROM] = "EFI_ROM";
        s_subsystem[pe::SUB_XBOX] = "XBOX";
        s_subsystem[pe::SUB_WINDOWS_BOOT_APP] = "WINDOWS_BOOT_APPLICATION";
    }
    if (s_subsystem.find(subsystem) == s_subsystem.end()) return "";
    return s_subsystem[subsystem];
}